

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

int cmd_ln_free_r(cmd_ln_t *cmdln)

{
  int iVar1;
  uint local_3c;
  int32 i;
  hash_entry_t *e;
  gnode_s *pgStack_28;
  int32 n;
  gnode_t *gn;
  glist_t entries;
  cmd_ln_t *cmdln_local;
  
  if (cmdln == (cmd_ln_t *)0x0) {
    cmdln_local._4_4_ = 0;
  }
  else {
    iVar1 = cmdln->refcount + -1;
    cmdln->refcount = iVar1;
    if (iVar1 < 1) {
      entries = (glist_t)cmdln;
      if (cmdln->ht != (hash_table_t *)0x0) {
        pgStack_28 = hash_table_tolist(cmdln->ht,(int32 *)((long)&e + 4));
        gn = pgStack_28;
        for (; pgStack_28 != (glist_t)0x0; pgStack_28 = pgStack_28->next) {
          cmd_ln_val_free(*(cmd_ln_val_t **)((pgStack_28->data).i + 0x10));
        }
        glist_free(gn);
        hash_table_free((hash_table_t *)entries->next);
        entries->next = (gnode_s *)0x0;
      }
      if (entries[1].data.ptr != (void *)0x0) {
        for (local_3c = 0; local_3c < *(uint *)&entries[1].next; local_3c = local_3c + 1) {
          ckd_free(*(void **)((long)entries[1].data.ptr + (long)(int)local_3c * 8));
        }
        ckd_free(entries[1].data.ptr);
        entries[1].data.ptr = (void *)0x0;
        *(undefined4 *)&entries[1].next = 0;
      }
      ckd_free(entries);
      cmdln_local._4_4_ = 0;
    }
    else {
      cmdln_local._4_4_ = cmdln->refcount;
    }
  }
  return cmdln_local._4_4_;
}

Assistant:

int
cmd_ln_free_r(cmd_ln_t *cmdln)
{
    if (cmdln == NULL)
        return 0;
    if (--cmdln->refcount > 0)
        return cmdln->refcount;

    if (cmdln->ht) {
        glist_t entries;
        gnode_t *gn;
        int32 n;

        entries = hash_table_tolist(cmdln->ht, &n);
        for (gn = entries; gn; gn = gnode_next(gn)) {
            hash_entry_t *e = (hash_entry_t *)gnode_ptr(gn);
            cmd_ln_val_free((cmd_ln_val_t *)e->val);
        }
        glist_free(entries);
        hash_table_free(cmdln->ht);
        cmdln->ht = NULL;
    }

    if (cmdln->f_argv) {
        int32 i;
        for (i = 0; i < cmdln->f_argc; ++i) {
            ckd_free(cmdln->f_argv[i]);
        }
        ckd_free(cmdln->f_argv);
        cmdln->f_argv = NULL;
        cmdln->f_argc = 0;
    }
    ckd_free(cmdln);
    return 0;
}